

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O3

IfTag * __thiscall Qentem::Tags::TagBit::MakeIfTag(TagBit *this)

{
  int *piVar1;
  IfTag *pIVar2;
  long lVar3;
  ulong uVar4;
  
  pIVar2 = (IfTag *)operator_new(0x18);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    MakeIfTag();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(pIVar2);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  pIVar2->Offset = 0;
  pIVar2->EndOffset = 0;
  (pIVar2->Cases).storage_ = (IfTagCase *)0x0;
  (pIVar2->Cases).index_ = 0;
  (pIVar2->Cases).capacity_ = 0;
  this->type_ = If;
  this->storage_ = pIVar2;
  return pIVar2;
}

Assistant:

IfTag *MakeIfTag() {
        IfTag *tag = Memory::AllocateInit<IfTag>();

        type_    = TagType::If;
        storage_ = tag;

        return tag;
    }